

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::saveSettingsFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,char *filename,bool onlyChanged,int solvemode)

{
  double dVar1;
  byte bVar2;
  uint32_t uVar3;
  ostream *poVar4;
  byte in_DL;
  char *in_RSI;
  char *pcVar5;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  ofstream file;
  undefined8 in_stack_fffffffffffffc58;
  fmtflags __fmtfl;
  ostream *in_stack_fffffffffffffc60;
  int local_23c;
  int local_238;
  int local_234;
  ostream local_220 [519];
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  std::ofstream::ofstream(local_220,in_RSI,_S_out);
  __fmtfl = (fmtflags)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  SPxOut::setScientific(in_stack_fffffffffffffc60,__fmtfl);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    local_1 = 0;
  }
  else {
    std::ios_base::setf((ios_base *)in_stack_fffffffffffffc60,__fmtfl);
    SPxOut::setFixed(in_stack_fffffffffffffc60,__fmtfl);
    poVar4 = std::operator<<(local_220,"# SoPlexBase version ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
    std::operator<<(poVar4,"\n");
    for (local_234 = 0; local_234 < 0x1a; local_234 = local_234 + 1) {
      if (((local_19 & 1) == 0) ||
         ((*(byte *)(*(long *)(in_RDI + 0x28) + (long)local_234) & 1) !=
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           ::Settings::boolParam[(long)local_234 + 0x680] & 1))) {
        std::operator<<(local_220,"\n");
        poVar4 = std::operator<<(local_220,"# ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         ::Settings::boolParam + (long)local_234 * 0x20 + 0x340));
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(local_220,"# range {true, false}, default ");
        pcVar5 = "false\n";
        if ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
             ::Settings::boolParam[(long)local_234 + 0x680] & 1) != 0) {
          pcVar5 = "true\n";
        }
        std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(local_220,"bool:");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         ::Settings::boolParam + (long)local_234 * 0x20));
        poVar4 = std::operator<<(poVar4," = ");
        pcVar5 = "false\n";
        if ((*(byte *)(*(long *)(in_RDI + 0x28) + (long)local_234) & 1) != 0) {
          pcVar5 = "true\n";
        }
        std::operator<<(poVar4,pcVar5);
      }
    }
    for (local_238 = 0; local_238 < 0x1c; local_238 = local_238 + 1) {
      if (((local_19 & 1) == 0) ||
         (*(int *)(*(long *)(in_RDI + 0x28) + 0x1c + (long)local_238 * 4) !=
          *(int *)(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   ::Settings::intParam + (long)local_238 * 4 + 0x700))) {
        std::operator<<(local_220,"\n");
        poVar4 = std::operator<<(local_220,"# ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         ::Settings::intParam + (long)local_238 * 0x20 + 0x380));
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(local_220,"# range [");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,*(int *)(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                            ::Settings::intParam + (long)local_238 * 4 + 0x770));
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,*(int *)(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                            ::Settings::intParam + (long)local_238 * 4 + 0x7e0));
        poVar4 = std::operator<<(poVar4,"], default ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,*(int *)(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                            ::Settings::intParam + (long)local_238 * 4 + 0x700));
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(local_220,"int:");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         ::Settings::intParam + (long)local_238 * 0x20));
        poVar4 = std::operator<<(poVar4," = ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,*(int *)(*(long *)(in_RDI + 0x28) + 0x1c + (long)local_238 * 4));
        std::operator<<(poVar4,"\n");
      }
    }
    SPxOut::setScientific(in_stack_fffffffffffffc60,__fmtfl);
    for (local_23c = 0; local_23c < 0x1b; local_23c = local_23c + 1) {
      if ((((local_19 & 1) == 0) ||
          (dVar1 = *(double *)(*(long *)(in_RDI + 0x28) + 0x90 + (long)local_23c * 8),
          dVar1 != *(double *)
                    (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     ::Settings::realParam + (long)local_23c * 8 + 0x6c0))) ||
         (NAN(dVar1) ||
          NAN(*(double *)
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ::Settings::realParam + (long)local_23c * 8 + 0x6c0)))) {
        std::operator<<(local_220,"\n");
        poVar4 = std::operator<<(local_220,"# ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         ::Settings::realParam + (long)local_23c * 0x20 + 0x360));
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(local_220,"# range [");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,*(double *)
                                    (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                     ::Settings::realParam + (long)local_23c * 8 + 0x798));
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,*(double *)
                                    (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                     ::Settings::realParam + (long)local_23c * 8 + 0x870));
        poVar4 = std::operator<<(poVar4,"], default ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,*(double *)
                                    (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                     ::Settings::realParam + (long)local_23c * 8 + 0x6c0));
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(local_220,"real:");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         ::Settings::realParam + (long)local_23c * 0x20));
        poVar4 = std::operator<<(poVar4," = ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,*(double *)
                                    (*(long *)(in_RDI + 0x28) + 0x90 + (long)local_23c * 8));
        std::operator<<(poVar4,"\n");
      }
    }
    if (((local_19 & 1) == 0) || (uVar3 = Random::getSeed((Random *)(in_RDI + 0x14e8)), uVar3 != 0))
    {
      std::operator<<(local_220,"\n");
      std::operator<<(local_220,"# initial random seed used for perturbation\n");
      poVar4 = std::operator<<(local_220,"# range [0, ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xffffffff);
      poVar4 = std::operator<<(poVar4,"], default ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
      std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(local_220,"uint:random_seed = ");
      uVar3 = Random::getSeed((Random *)(in_RDI + 0x14e8));
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      std::operator<<(poVar4,"\n");
    }
    local_1 = 1;
  }
  std::ofstream::~ofstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool SoPlexBase<R>::saveSettingsFile(const char* filename, const bool onlyChanged,
                                     int solvemode) const
{
   assert(filename != nullptr);

   std::ofstream file(filename);
   SPxOut::setScientific(file, 16);

   if(!file.good())
      return false;

   file.setf(std::ios::left);

   SPxOut::setFixed(file);

   file << "# SoPlexBase version " << SOPLEX_VERSION / 100 << "." << (SOPLEX_VERSION / 10) % 10 << "."
        << SOPLEX_VERSION % 10 << "\n";

   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_boolParamValues[i] == _currentSettings->boolParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->boolParam.description[i] << "\n";
      file << "# range {true, false}, default " << (_currentSettings->boolParam.defaultValue[i] ?
            "true\n" : "false\n");
      file << "bool:" << _currentSettings->boolParam.name[i] << " = " <<
           (_currentSettings->_boolParamValues[i] ? "true\n" : "false\n");
   }

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_intParamValues[i] == _currentSettings->intParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->intParam.description[i] << "\n";
      file << "# range [" << _currentSettings->intParam.lower[i] << "," <<
           _currentSettings->intParam.upper[i]
           << "], default " << _currentSettings->intParam.defaultValue[i] << "\n";
      file << "int:" << _currentSettings->intParam.name[i] << " = " <<
           _currentSettings->_intParamValues[i] << "\n";
   }

   SPxOut::setScientific(file);

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_realParamValues[i] == _currentSettings->realParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->realParam.description[i] << "\n";
      file << "# range [" << _currentSettings->realParam.lower[i] << "," <<
           _currentSettings->realParam.upper[i]
           << "], default " << _currentSettings->realParam.defaultValue[i] << "\n";
      file << "real:" << _currentSettings->realParam.name[i] << " = " <<
           _currentSettings->_realParamValues[i] << "\n";
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_rationalParamValues[i] == _currentSettings->rationalParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->rationalParam.description[i] << "\n";
      file << "# range [" << _currentSettings->rationalParam.lower[i] << "," <<
           _currentSettings->rationalParam.upper[i]
           << "], default " << _currentSettings->rationalParam.defaultValue[i] << "\n";
      file << "rational:" << _currentSettings->rationalParam.name[i] << " = " <<
           _currentSettings->_rationalParamValues[i] << "\n";
   }

#endif

   if(!onlyChanged || _solver.random.getSeed() != SOPLEX_DEFAULT_RANDOM_SEED)
   {
      file << "\n";
      file << "# initial random seed used for perturbation\n";
      file << "# range [0, " << UINT_MAX << "], default " << SOPLEX_DEFAULT_RANDOM_SEED << "\n";
      file << "uint:random_seed = " << _solver.random.getSeed() << "\n";
   }

   return true;
}